

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchGetRootMethod<false,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,DynamicObject *object,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *local_88;
  Var value;
  PropertyValueInfo info;
  ScriptContext *scriptContext;
  PropertyId propertyId_local;
  DynamicObject *object_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  if (inlineCache == (InlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2096,"(inlineCache != nullptr)","inlineCache != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = VarIs<Js::RootObjectBase,Js::DynamicObject>(object);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2098,"(VarIs<RootObjectBase>(object))",
                                "Root must be a global object!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  info._56_8_ = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)&value,functionBody,inlineCache,inlineCacheIndex,true);
  bVar2 = CacheOperators::TryGetProperty<true,true,true,false,true,false,true,false,false,false>
                    (object,true,&object->super_RecyclableObject,propertyId,&local_88,
                     (ScriptContext *)info._56_8_,(PropertyCacheOperationInfo *)0x0,
                     (PropertyValueInfo *)&value);
  if (bVar2) {
    functionBody_local = local_88;
  }
  else {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
    if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchGetRootMethod",propertyId,(ScriptContext *)info._56_8_,
                 &object->super_RecyclableObject);
    }
    functionBody_local =
         (FunctionBody *)
         PatchGetMethodFromObject
                   (object,&object->super_RecyclableObject,propertyId,(PropertyValueInfo *)&value,
                    (ScriptContext *)info._56_8_,true);
  }
  return functionBody_local;
}

Assistant:

inline Var JavascriptOperators::PatchGetRootMethod(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, DynamicObject* object, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetRootMethod);
        Assert(inlineCache != nullptr);

        AssertMsg(VarIs<RootObjectBase>(object), "Root must be a global object!");

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        Var value;
        if (CacheOperators::TryGetProperty<true, true, true, false, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
                object, true, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetRootMethod"), propertyId, scriptContext, object);
        }
#endif

        value = Js::JavascriptOperators::PatchGetMethodFromObject(object, object, propertyId, &info, scriptContext, true);
#ifdef TELEMETRY_JSO
        if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
        {
            // `successful` will be true as PatchGetMethod throws an exception if not found.
            scriptContext->GetTelemetry().GetOpcodeTelemetry().GetMethodProperty(object, propertyId, value, /*successful:*/ true);
        }
#endif
        return value;
        JIT_HELPER_END(Op_PatchGetRootMethod);
    }